

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_cast.c
# Opt level: O0

value value_type_cast(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  type_id tVar2;
  void *pvVar3;
  size_t sVar4;
  long *plVar5;
  value v_00;
  value pvVar6;
  type_id in_ESI;
  value in_RDI;
  float fVar7;
  double dVar8;
  int64_t data_1;
  value dest_5;
  double d;
  float f;
  int64_t data;
  value dest_4;
  value cast;
  value dest_3;
  value *values;
  value dest_2;
  value dest_1;
  value dest;
  size_t dest_size;
  size_t src_size;
  type_id src_id;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  value in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  value in_stack_ffffffffffffff80;
  value v_01;
  value in_stack_ffffffffffffff88;
  type_id in_stack_ffffffffffffff94;
  value in_stack_ffffffffffffff98;
  value local_50;
  value in_stack_ffffffffffffffe0;
  value local_8;
  
  id_00 = value_type_id(in_stack_ffffffffffffff80);
  iVar1 = type_id_invalid(id_00);
  if ((iVar1 == 0) || (iVar1 = type_id_invalid(in_ESI), iVar1 == 0)) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = in_RDI;
    if (id_00 != in_ESI) {
      iVar1 = type_id_string(id_00);
      if (iVar1 == 0) {
        local_8 = (value)0x0;
      }
      else {
        iVar1 = type_id_string(in_ESI);
        if (iVar1 == 0) {
          local_8 = (value)0x0;
        }
        else {
          iVar1 = type_id_null(id_00);
          if (iVar1 == 0) {
            iVar1 = type_id_boolean(in_ESI);
            if (iVar1 != 0) {
              type_id_array(in_ESI);
            }
          }
          else {
            iVar1 = type_id_null(in_ESI);
            if (iVar1 == 0) {
              local_8 = value_create_null();
              if (local_8 == (value)0x0) {
                local_8 = (value)0x0;
              }
              else {
                value_type_destroy(in_stack_ffffffffffffffe0);
              }
            }
            else {
              iVar1 = type_id_buffer(in_ESI);
              if ((iVar1 == 0) && (id_00 < 8)) {
                pvVar3 = value_data(in_RDI);
                value_type_id_size((type_id)in_stack_ffffffffffffff6c);
                local_8 = value_type_create(in_stack_ffffffffffffff78,(size_t)pvVar3,
                                            (type_id)in_stack_ffffffffffffff6c);
                if (local_8 == (value)0x0) {
                  local_8 = (value)0x0;
                }
                else {
                  value_type_destroy(in_stack_ffffffffffffffe0);
                }
              }
              else {
                iVar1 = type_id_array(in_ESI);
                if ((iVar1 == 0) && (id_00 < 8)) {
                  local_8 = value_type_create(in_stack_ffffffffffffff78,
                                              (size_t)in_stack_ffffffffffffff70,
                                              (type_id)in_stack_ffffffffffffff6c);
                  if (local_8 == (value)0x0) {
                    local_8 = (value)0x0;
                  }
                  else {
                    value_type_destroy(in_stack_ffffffffffffffe0);
                  }
                }
                else {
                  iVar1 = type_id_array(id_00);
                  if (((iVar1 == 0) && (in_ESI < 8)) &&
                     (sVar4 = value_type_size(in_stack_ffffffffffffff70), sVar4 == 8)) {
                    plVar5 = (long *)value_data(in_RDI);
                    local_50 = (value)*plVar5;
                    if (local_50 == (value)0x0) {
                      local_8 = (value)0x0;
                    }
                    else {
                      tVar2 = value_type_id(in_stack_ffffffffffffff80);
                      if (((tVar2 == in_ESI) ||
                          (tVar2 = value_type_id(in_stack_ffffffffffffff80), 7 < tVar2)) ||
                         (local_50 = value_type_cast((value)CONCAT44(in_ESI,id_00),
                                                     (type_id)((ulong)in_stack_ffffffffffffffe0 >>
                                                              0x20)), local_50 != (value)0x0)) {
                        value_type_destroy(in_stack_ffffffffffffffe0);
                        local_8 = local_50;
                      }
                      else {
                        local_8 = (value)0x0;
                      }
                    }
                  }
                  else {
                    v_00 = (value)value_type_id_size((type_id)in_stack_ffffffffffffff6c);
                    pvVar6 = (value)value_type_id_size((type_id)in_stack_ffffffffffffff6c);
                    if (id_00 < in_ESI) {
                      iVar1 = type_id_integer(id_00);
                      if ((iVar1 == 0) && (iVar1 = type_id_integer(in_ESI), iVar1 == 0)) {
                        local_8 = value_type_promotion_integer
                                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
                      }
                      else {
                        iVar1 = type_id_decimal(id_00);
                        if ((iVar1 == 0) && (iVar1 = type_id_decimal(in_ESI), iVar1 == 0)) {
                          local_8 = value_type_promotion_decimal
                                              (in_stack_ffffffffffffff88,
                                               (type_id)((ulong)in_stack_ffffffffffffff80 >> 0x20));
                        }
                        else {
                          iVar1 = type_id_integer(id_00);
                          if ((iVar1 == 0) && (iVar1 = type_id_decimal(in_ESI), iVar1 == 0)) {
                            value_to(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                     (size_t)in_stack_ffffffffffffff70);
                            if (v_00 == pvVar6) {
                              value_from(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                         (size_t)in_stack_ffffffffffffff70);
                            }
                            else {
                              pvVar6 = value_type_create(in_stack_ffffffffffffff78,
                                                         (size_t)in_stack_ffffffffffffff70,
                                                         (type_id)in_stack_ffffffffffffff6c);
                              if (pvVar6 != (value)0x0) {
                                value_type_destroy(v_00);
                              }
                            }
                            if (in_ESI == 5) {
                              local_8 = value_from_float(in_stack_ffffffffffffff70,
                                                         in_stack_ffffffffffffff6c);
                            }
                            else if (in_ESI == 6) {
                              local_8 = value_from_double(in_stack_ffffffffffffff70,
                                                          (double)CONCAT44(in_stack_ffffffffffffff6c
                                                                           ,
                                                  in_stack_ffffffffffffff68));
                            }
                            else {
                              local_8 = (value)0x0;
                            }
                          }
                          else {
                            local_8 = (value)0x0;
                          }
                        }
                      }
                    }
                    else if (in_ESI < id_00) {
                      iVar1 = type_id_boolean(in_ESI);
                      tVar2 = (type_id)((ulong)in_stack_ffffffffffffff80 >> 0x20);
                      if (iVar1 == 0) {
                        local_8 = value_type_demotion_boolean
                                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
                      }
                      else {
                        iVar1 = type_id_integer(id_00);
                        if ((iVar1 == 0) && (iVar1 = type_id_integer(in_ESI), iVar1 == 0)) {
                          local_8 = value_type_demotion_integer
                                              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
                        }
                        else {
                          iVar1 = type_id_decimal(id_00);
                          if ((iVar1 == 0) && (iVar1 = type_id_decimal(in_ESI), iVar1 == 0)) {
                            local_8 = value_type_demotion_decimal(in_stack_ffffffffffffff88,tVar2);
                          }
                          else {
                            iVar1 = type_id_decimal(id_00);
                            if ((iVar1 == 0) && (iVar1 = type_id_integer(in_ESI), iVar1 == 0)) {
                              v_01 = (value)0x0;
                              if (id_00 == 5) {
                                fVar7 = value_to_float(in_stack_ffffffffffffff70);
                                pvVar3 = (void *)(long)fVar7;
                              }
                              else {
                                if (id_00 != 6) {
                                  return (value)0x0;
                                }
                                dVar8 = value_to_double(in_stack_ffffffffffffff70);
                                pvVar3 = (void *)(long)dVar8;
                              }
                              if (v_00 == pvVar6) {
                                value_from(v_01,pvVar3,(size_t)in_stack_ffffffffffffff70);
                              }
                              else {
                                in_RDI = value_type_create(pvVar3,(size_t)in_stack_ffffffffffffff70,
                                                           (type_id)in_stack_ffffffffffffff6c);
                                if (in_RDI != (value)0x0) {
                                  value_type_destroy(v_00);
                                }
                              }
                              local_8 = value_from(in_RDI,pvVar3,(size_t)in_stack_ffffffffffffff70);
                            }
                            else {
                              local_8 = (value)0x0;
                            }
                          }
                        }
                      }
                    }
                    else {
                      local_8 = (value)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

value value_type_cast(value v, type_id id)
{
	type_id src_id = value_type_id(v);

	size_t src_size, dest_size;

	/* Invalid source value type */
	if (type_id_invalid(src_id) == 0 || type_id_invalid(id) == 0)
	{
		return NULL;
	}

	/* Equal types, avoid casting */
	if (src_id == id)
	{
		return v;
	}

	/* Cast from string to any type */
	if (type_id_string(src_id) == 0)
	{
		/*return value_type_parse(v, id);*/

		return NULL;
	}

	/* Cast from any type to string */
	if (type_id_string(id) == 0)
	{
		/*return value_type_stringify(v);*/

		return NULL;
	}

	/* TODO: Cast from null value */
	if (type_id_null(src_id) == 0)
	{
		if (type_id_boolean(id) == 0)
		{
			/* TODO: Create boolean set to false */
			/*
			return value_type_create_bool
			*/
		}
		/*
		...
		*/
		else if (type_id_array(id) == 0)
		{
			/* TODO: Create an empty array */
			/*
			return value_type_create_bool
			*/
		}

		return v;
	}

	/* Cast to null value  */
	if (type_id_null(id) == 0)
	{
		value dest = value_create_null();

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* Convert single value to buffer */
	if (type_id_buffer(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(value_data(v), value_type_id_size(src_id), TYPE_BUFFER);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert buffer to array */

	/* TODO: Convert buffer of size 1 to a single type */

	/* Convert single value to array */
	if (type_id_array(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(&v, sizeof(value), TYPE_ARRAY);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert array to buffer */

	/* Convert array of size 1 to a single type */
	if (type_id_array(src_id) == 0 && id < TYPE_BUFFER && value_type_size(v) == sizeof(value))
	{
		value *values = value_data(v);

		value dest = values[0];

		if (dest == NULL)
		{
			return NULL;
		}

		if (value_type_id(dest) != id && value_type_id(dest) < TYPE_BUFFER)
		{
			value cast = value_type_cast(dest, id);

			if (cast == NULL)
			{
				return NULL;
			}

			dest = cast;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Map */

	src_size = value_type_id_size(src_id);

	dest_size = value_type_id_size(id);

	/* Promote value type */
	if (src_id < id)
	{
		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_promotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_promotion_decimal(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_decimal(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			value_to(v, &data, src_size);

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			if (id == TYPE_FLOAT)
			{
				float f = (float)data;

				return value_from_float(dest, f);
			}
			else if (id == TYPE_DOUBLE)
			{
				double d = (double)data;

				return value_from_double(dest, d);
			}

			return NULL;
		}

		return NULL;
	}

	/* Demote value type */
	if (src_id > id)
	{
		if (type_id_boolean(id) == 0)
		{
			return value_type_demotion_boolean(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_demotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_demotion_decimal(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_integer(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			if (src_id == TYPE_FLOAT)
			{
				data = (int64_t)value_to_float(v);
			}
			else if (src_id == TYPE_DOUBLE)
			{
				data = (int64_t)value_to_double(v);
			}
			else
			{
				return NULL;
			}

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			return value_from(dest, &data, dest_size);
		}

		return NULL;
	}

	return NULL;
}